

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::emplace_at<std::__cxx11::string_const&>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           *this,iterator iter,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  bool bVar2;
  reference key;
  iterator local_40;
  iterator local_30;
  iterator local_20;
  
  local_20.field_1 = iter.field_1;
  local_20.ctrl_ = iter.ctrl_;
  pcVar1 = (args->_M_dataplus)._M_p;
  (local_20.field_1.slot_)->_M_len = args->_M_string_length;
  (local_20.field_1.slot_)->_M_str = pcVar1;
  key = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::iterator::operator*(&local_20);
  local_30 = find<std::basic_string_view<char,std::char_traits<char>>>(this,key);
  local_40.ctrl_ = local_20.ctrl_;
  local_40.field_1.slot_ = local_20.field_1.slot_;
  bVar2 = container_internal::operator==(&local_30,&local_40);
  if (bVar2) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, Args = <const std::basic_string<char> &>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }